

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

void __thiscall Cmd::~Cmd(Cmd *this)

{
  long *plVar1;
  _Alloc_hider _Var2;
  _Manager_type p_Var3;
  pointer pcVar4;
  int iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  if (this->raw_mode_ == true) {
    iVar5 = tcsetattr(this->in_fd_,2,(termios *)&this->orig_termios_);
    if (iVar5 != -1) {
      this->raw_mode_ = false;
    }
  }
  saveHistory(this);
  if ((this->history_file_).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    (this->history_file_).
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    _Var2._M_p = (this->history_file_).
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    plVar1 = (long *)((long)&(this->history_file_).
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10);
    if ((long *)_Var2._M_p != plVar1) {
      operator_delete(_Var2._M_p,*plVar1 + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->history_);
  p_Var3 = (this->hints_handler_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->hints_handler_,(_Any_data *)&this->hints_handler_,
              __destroy_functor);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
  ::~_Rb_tree(&(this->commands_)._M_t);
  pcVar4 = (this->prompt)._M_dataplus._M_p;
  paVar6 = &(this->prompt).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar6) {
    operator_delete(pcVar4,paVar6->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Cmd() {
		// At exit we'll try to fix the terminal to the initial conditions.
		disableRawMode(in_fd_);
		saveHistory();
	}